

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::ExpressionNode::do_render
          (ExpressionNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  runtime_error *this_00;
  Value *in_RSI;
  char *pcVar2;
  long in_RDI;
  Value result;
  bool in_stack_000000c3;
  int in_stack_000000c4;
  Value *in_stack_000000c8;
  shared_ptr<minja::Context> *in_stack_00000100;
  Expression *in_stack_00000108;
  Value *in_stack_ffffffffffffff20;
  string local_b8 [32];
  string local_98 [8];
  Value *in_stack_ffffffffffffff70;
  Value *in_stack_ffffffffffffff88;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x20));
  if (bVar1) {
    std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x31c645);
    Expression::evaluate(in_stack_00000108,in_stack_00000100);
    bVar1 = Value::is_string((Value *)0x31c664);
    if (bVar1) {
      Value::get<std::__cxx11::string>(in_stack_ffffffffffffff88);
      std::operator<<((ostream *)in_RSI,local_98);
      std::__cxx11::string::~string(local_98);
    }
    else {
      bVar1 = Value::is_boolean((Value *)0x31c6ee);
      if (bVar1) {
        bVar1 = Value::get<bool>(in_stack_ffffffffffffff70);
        pcVar2 = "False";
        if (bVar1) {
          pcVar2 = "True";
        }
        std::operator<<((ostream *)in_RSI,pcVar2);
        in_stack_ffffffffffffff20 = in_RSI;
      }
      else {
        bVar1 = Value::is_null(in_stack_ffffffffffffff20);
        if (!bVar1) {
          Value::dump_abi_cxx11_(in_stack_000000c8,in_stack_000000c4,in_stack_000000c3);
          std::operator<<((ostream *)in_RSI,local_b8);
          std::__cxx11::string::~string(local_b8);
        }
      }
    }
    Value::~Value(in_stack_ffffffffffffff20);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"ExpressionNode.expr is null");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void do_render(std::ostringstream & out, const std::shared_ptr<Context> & context) const override {
      if (!expr) throw std::runtime_error("ExpressionNode.expr is null");
      auto result = expr->evaluate(context);
      if (result.is_string()) {
          out << result.get<std::string>();
      } else if (result.is_boolean()) {
          out << (result.get<bool>() ? "True" : "False");
      } else if (!result.is_null()) {
          out << result.dump();
      }
  }